

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O1

void __thiscall
fmcalc::dofm(fmcalc *this,int event_id,vector<int,_std::allocator<int>_> *items,
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *event_guls)

{
  vector<LossRec,_std::allocator<LossRec>_> *this_00;
  vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
  *this_01;
  pointer pvVar1;
  long lVar2;
  iterator iVar3;
  pointer pvVar4;
  int *piVar5;
  long lVar6;
  float *pfVar7;
  undefined4 *puVar8;
  pointer pfVar9;
  pointer piVar10;
  pointer piVar11;
  long lVar12;
  pointer pfVar13;
  _Base_ptr p_Var14;
  long lVar15;
  pointer ppVar16;
  pointer pvVar17;
  fmcalc *pfVar18;
  pointer pvVar19;
  float *pfVar20;
  _Base_ptr p_Var21;
  undefined8 extraout_RAX;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  int *piVar26;
  size_type sVar27;
  undefined4 *puVar28;
  vector<int,_std::allocator<int>_> *this_02;
  int iVar29;
  int iVar30;
  fmlevelrec *y;
  _Base_ptr __ptr;
  uint uVar31;
  vector<float,_std::allocator<float>_> *__range1;
  long lVar32;
  fmcalc *this_03;
  ulong uVar33;
  long lVar34;
  pointer pvVar35;
  bool bVar36;
  float fVar37;
  map<int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
  outmap;
  size_type local_c0;
  int event_id_local;
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  avxs;
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  agg_vecs;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  aggid_to_vectorlookups;
  fmlevelrec r;
  
  event_id_local = event_id;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&aggid_to_vectorlookups,(long)this->maxLevel_ + 1,(allocator_type *)&outmap);
  pvVar35 = aggid_to_vectorlookups.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar27 = (size_type)
           *(this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (sVar27 == 0xffffffffffffffff) {
LAB_00103fa7:
    dofm();
    std::
    vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
    ::~vector(&avxs);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&aggid_to_vectorlookups);
    _Unwind_Resume(extraout_RAX);
  }
  outmap._M_t._M_impl._0_4_ = 0xfffffffe;
  std::vector<int,_std::allocator<int>_>::resize
            (aggid_to_vectorlookups.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,sVar27,(value_type_conflict1 *)&outmap);
  avxs.
  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avxs.
  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avxs.
  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ::resize(&avxs,(long)this->maxLevel_ + 1);
  pvVar1 = avxs.
           super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar19 = (event_guls->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((event_guls->
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar19) {
    local_c0 = 0;
  }
  else {
    std::
    vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
    ::resize(avxs.
             super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(long)this->max_layer_ + 1);
    local_c0 = 0;
    if ((pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_finish !=
        (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
        ._M_start) {
      uVar31 = 1;
      uVar22 = 0;
      iVar29 = 0;
      do {
        iVar25 = uVar31 - 1;
        iVar30 = *(int *)(*(long *)&(((this->pfm_vec_vec_).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data +
                         (long)(items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[uVar22] * 4);
        lVar32 = (long)iVar30;
        lVar15 = (long)(pvVar35->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar32 + -1];
        if (lVar15 == -2) {
          outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
          outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          outmap._M_t._M_impl._4_4_ = iVar30;
          outmap._M_t._M_impl._0_4_ =
               *(undefined4 *)
                (*(long *)(*(long *)&(((this->policy_tc_vec_vec_vec_).
                                       super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data + lVar32 * 0x18) + 4);
          std::vector<policytcvidx,_std::allocator<policytcvidx>_>::push_back
                    ((pvVar1->
                     super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1,(value_type *)&outmap);
          ppVar16 = *(pointer *)
                     ((long)&(pvVar1->
                             super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[1].
                             super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl
                             .super__Vector_impl_data + 8);
          iVar3._M_current =
               *(pointer *)
                ((long)&ppVar16[-1].item_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                8);
          agg_vecs.
          super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar25;
          if (iVar3._M_current ==
              *(pointer *)
               ((long)&ppVar16[-1].item_idx.super__Vector_base<int,_std::allocator<int>_>._M_impl +
               0x10)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&ppVar16[-1].item_idx,iVar3,(int *)&agg_vecs);
          }
          else {
            *iVar3._M_current = iVar25;
            *(int **)((long)&ppVar16[-1].item_idx.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + 8) = iVar3._M_current + 1;
          }
          pvVar4 = (pvVar1->
                   super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          (pvVar35->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar32 + -1] =
               (int)((ulong)((long)*(pointer *)
                                    ((long)&pvVar4[1].
                                            super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                            *(long *)&pvVar4[1].
                                      super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                      ._M_impl.super__Vector_impl_data) >> 3) * -0x33333333 + -1;
          if (outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            operator_delete(outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          }
          iVar29 = iVar29 + 1;
        }
        else {
          lVar15 = *(long *)&(pvVar1->
                             super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[1].
                             super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl
                             .super__Vector_impl_data + lVar15 * 0x28;
          outmap._M_t._M_impl._0_4_ = iVar25;
          iVar3._M_current = *(int **)(lVar15 + 0x18);
          if (iVar3._M_current == *(int **)(lVar15 + 0x20)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)(lVar15 + 0x10),iVar3,(int *)&outmap);
          }
          else {
            *iVar3._M_current = iVar25;
            *(int **)(lVar15 + 0x18) = iVar3._M_current + 1;
          }
        }
        uVar22 = (ulong)uVar31;
        uVar31 = uVar31 + 1;
      } while (uVar22 < (ulong)((long)(pvVar19->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar19->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_start >> 2));
      local_c0 = (size_type)iVar29;
    }
    if (1 < (ulong)(((long)avxs.
                           super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)avxs.
                           super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      this_03 = (fmcalc *)0x1;
      do {
        pvVar1 = avxs.
                 super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_01 = avxs.
                  super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)this_03;
        std::
        vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
        ::resize(this_01,(long)this->max_layer_ + 1);
        sVar27 = (size_type)
                 (this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)this_03];
        if (sVar27 == 0xffffffffffffffff) {
          dofm(this_03);
          goto LAB_00103fa7;
        }
        this_02 = aggid_to_vectorlookups.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)this_03;
        outmap._M_t._M_impl._0_4_ = 0xfffffffe;
        std::vector<int,_std::allocator<int>_>::resize
                  (this_02,sVar27,(value_type_conflict1 *)&outmap);
        pvVar1 = pvVar1 + ((int)this_03 - 1);
        pvVar4 = (pvVar1->
                 super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar16 = pvVar4[1].super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar4[1].super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                     _M_impl.super__Vector_impl_data + 8) != ppVar16) {
          uVar22 = 0;
          do {
            iVar29 = *(int *)(*(long *)&(this->pfm_vec_vec_).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(long)this_03].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data + (long)ppVar16[uVar22].agg_id * 4);
            lVar15 = (long)iVar29;
            lVar32 = (long)(this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar15 + -1];
            if (lVar32 == -2) {
              pvVar17 = (this->policy_tc_vec_vec_vec_).
                        super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar32 = *(long *)&pvVar17[(long)this_03].
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data;
              if (4 < (ulong)(*(long *)(lVar32 + 8 + lVar15 * 0x18) -
                             *(long *)(lVar32 + lVar15 * 0x18))) {
                pvVar17 = pvVar17 + (long)this_03;
                uVar33 = 1;
                do {
                  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
                  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
                  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
                  outmap._M_t._M_impl._4_4_ = iVar29;
                  outmap._M_t._M_impl._0_4_ =
                       *(undefined4 *)
                        (*(long *)(*(long *)&(pvVar17->
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             )._M_impl.super__Vector_impl_data + lVar15 * 0x18) +
                        uVar33 * 4);
                  std::vector<policytcvidx,_std::allocator<policytcvidx>_>::push_back
                            ((this_01->
                             super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar33,
                             (value_type *)&outmap);
                  lVar32 = *(long *)&(pvVar1->
                                     super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[1].
                                     super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                     ._M_impl.super__Vector_impl_data;
                  piVar26 = *(int **)(lVar32 + 0x10 + uVar22 * 0x28);
                  piVar5 = *(int **)(lVar32 + 0x18 + uVar22 * 0x28);
                  if (piVar26 != piVar5) {
                    pvVar4 = (this_01->
                             super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    ppVar16 = *(pointer *)
                               ((long)&pvVar4[uVar33].
                                       super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                       ._M_impl.super__Vector_impl_data + 8);
                    lVar32 = *(long *)&pvVar4[uVar33].
                                       super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                       ._M_impl.super__Vector_impl_data;
                    do {
                      agg_vecs.
                      super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ = *piVar26;
                      lVar6 = *(long *)&(this_01->
                                        super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar33].
                                        super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                        ._M_impl.super__Vector_impl_data;
                      iVar3._M_current = *(int **)((long)ppVar16 + ((lVar6 + -0x10) - lVar32));
                      if (iVar3._M_current == *(int **)((long)ppVar16 + ((lVar6 + -8) - lVar32))) {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)
                                   ((long)ppVar16 + (lVar6 - lVar32) + -0x18),iVar3,(int *)&agg_vecs
                                  );
                      }
                      else {
                        *iVar3._M_current =
                             (int)agg_vecs.
                                  super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        *(int **)((long)ppVar16 + (lVar6 - lVar32) + -0x10) = iVar3._M_current + 1;
                      }
                      piVar26 = piVar26 + 1;
                    } while (piVar26 != piVar5);
                  }
                  pvVar4 = (this_01->
                           super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  (this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar15 + -1] =
                       (int)((ulong)((long)*(pointer *)
                                            ((long)&pvVar4[uVar33].
                                                                                                        
                                                  super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                    *(long *)&pvVar4[uVar33].
                                              super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                              ._M_impl.super__Vector_impl_data) >> 3) * -0x33333333
                       + -1;
                  if (outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                      (_Base_ptr)0x0) {
                    operator_delete(outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                  }
                  pvVar17 = (this->policy_tc_vec_vec_vec_).
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)this_03;
                  lVar32 = *(long *)&(pvVar17->
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data;
                  uVar33 = (ulong)((int)uVar33 + 1);
                } while (uVar33 < (ulong)(*(long *)(lVar32 + 8 + lVar15 * 0x18) -
                                          *(long *)(lVar32 + lVar15 * 0x18) >> 2));
              }
            }
            else {
              lVar6 = *(long *)&(this->policy_tc_vec_vec_vec_).
                                super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)this_03].
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              if (4 < (ulong)(*(long *)(lVar6 + 8 + lVar15 * 0x18) -
                             *(long *)(lVar6 + lVar15 * 0x18))) {
                uVar33 = 1;
                do {
                  lVar6 = *(long *)&(pvVar1->
                                    super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[1].
                                    super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                                    _M_impl.super__Vector_impl_data;
                  piVar5 = *(int **)(lVar6 + 0x18 + uVar22 * 0x28);
                  for (piVar26 = *(int **)(lVar6 + 0x10 + uVar22 * 0x28); piVar26 != piVar5;
                      piVar26 = piVar26 + 1) {
                    outmap._M_t._M_impl._0_4_ = *piVar26;
                    lVar6 = *(long *)&(this_01->
                                      super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar33].
                                      super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                      ._M_impl.super__Vector_impl_data + lVar32 * 0x28;
                    iVar3._M_current = *(int **)(lVar6 + 0x18);
                    if (iVar3._M_current == *(int **)(lVar6 + 0x20)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)(lVar6 + 0x10),iVar3,
                                 (int *)&outmap);
                    }
                    else {
                      *iVar3._M_current = *piVar26;
                      *(int **)(lVar6 + 0x18) = iVar3._M_current + 1;
                    }
                  }
                  lVar6 = *(long *)&(this->policy_tc_vec_vec_vec_).
                                    super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)this_03].
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data;
                  uVar33 = (ulong)((int)uVar33 + 1);
                } while (uVar33 < (ulong)(*(long *)(lVar6 + 8 + lVar15 * 0x18) -
                                          *(long *)(lVar6 + lVar15 * 0x18) >> 2));
              }
            }
            uVar22 = (ulong)((int)uVar22 + 1);
            pvVar4 = (pvVar1->
                     super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            ppVar16 = pvVar4[1].super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar33 = ((long)*(pointer *)
                             ((long)&pvVar4[1].
                                     super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>
                                     ._M_impl.super__Vector_impl_data + 8) - (long)ppVar16 >> 3) *
                     -0x3333333333333333;
          } while (uVar22 <= uVar33 && uVar33 - uVar22 != 0);
        }
        this_03 = (fmcalc *)(ulong)((int)this_03 + 1);
        pfVar18 = (fmcalc *)
                  (((long)avxs.
                          super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)avxs.
                          super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      } while (this_03 <= pfVar18 && (long)pfVar18 - (long)this_03 != 0);
    }
  }
  std::
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  ::vector(&agg_vecs,(long)this->maxLevel_ + 1,(allocator_type *)&outmap);
  if (-1 < this->maxLevel_) {
    lVar15 = -1;
    lVar32 = 0;
    do {
      std::
      vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
      ::resize((vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                *)(CONCAT44(agg_vecs.
                            super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)agg_vecs.
                                 super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) + lVar32),
               (long)this->max_layer_ + 1);
      lVar15 = lVar15 + 1;
      lVar32 = lVar32 + 0x18;
    } while (lVar15 < this->maxLevel_);
  }
  lVar15 = *(long *)CONCAT44(agg_vecs.
                             super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)agg_vecs.
                                  super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &outmap._M_t._M_impl.super__Rb_tree_header._M_header;
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar22 = 0;
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  outmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar19 = (event_guls->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((event_guls->
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar19) {
    this_00 = (vector<LossRec,_std::allocator<LossRec>_> *)(lVar15 + 0x18);
    do {
      pvVar19 = pvVar19 + uVar22;
      uVar31 = (uint)uVar22;
      if (uVar31 < 2) {
LAB_00103c93:
        std::vector<LossRec,_std::allocator<LossRec>_>::resize(this_00,local_c0);
        puVar8 = *(undefined4 **)(lVar15 + 0x18);
        lVar32 = *(long *)(lVar15 + 0x20) - (long)puVar8;
        if (lVar32 != 0) {
          uVar22 = (lVar32 >> 5) * -0x5555555555555555;
          uVar23 = 1;
          puVar28 = puVar8;
          do {
            *puVar28 = 0;
            uVar33 = (ulong)uVar23;
            puVar28 = puVar28 + 0x18;
            uVar23 = uVar23 + 1;
          } while (uVar33 <= uVar22 && uVar22 - uVar33 != 0);
        }
        pfVar9 = (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar32 = (long)(pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pfVar9;
        if (lVar32 != 0) {
          piVar10 = (items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar6 = *(long *)&(((this->pfm_vec_vec_).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data;
          piVar11 = (pvVar35->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar12 = *(long *)&((avxs.
                               super__Vector_base<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[1].
                             super__Vector_base<policytcvidx,_std::allocator<policytcvidx>_>._M_impl
                             .super__Vector_impl_data;
          bVar36 = this->isGULStreamType_;
          pfVar13 = (this->item_to_tiv_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar30 = -1;
          iVar29 = 0;
          uVar22 = 1;
          do {
            iVar25 = *(int *)(lVar6 + (long)piVar10[uVar22 - 1] * 4);
            if (iVar30 != iVar25) {
              iVar29 = (pvVar35->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[(long)iVar25 + -1];
              iVar30 = iVar25;
            }
            lVar34 = (long)iVar29;
            puVar8[lVar34 * 0x18] = pfVar9[uVar22 - 1] + (float)puVar8[lVar34 * 0x18];
            lVar24 = (long)piVar11[(long)iVar25 + -1];
            lVar2 = lVar12 + 0x10 + lVar24 * 0x28;
            puVar8[lVar34 * 0x18 + 10] = *(undefined4 *)(lVar2 + -0xc);
            *(long *)(puVar8 + lVar34 * 0x18 + 0xe) = lVar2;
            fVar37 = 0.0;
            if (bVar36 != false) {
              fVar37 = pfVar13[piVar10[uVar22 - 1]];
            }
            puVar8[lVar34 * 0x18 + 6] = fVar37;
            puVar8[lVar34 * 0x18 + 0xb] = *(undefined4 *)(lVar12 + lVar24 * 0x28);
            uVar33 = uVar22 & 0xffffffff;
            uVar22 = uVar22 + 1;
          } while (uVar33 < (ulong)(lVar32 >> 2));
        }
        dofmcalc_r(this,&aggid_to_vectorlookups,&agg_vecs,1,this->maxLevel_,&outmap,uVar31,&avxs,1,
                   items,event_guls,1);
        std::vector<LossRec,_std::allocator<LossRec>_>::_M_erase_at_end
                  (this_00,(this_00->super__Vector_base<LossRec,_std::allocator<LossRec>_>)._M_impl.
                           super__Vector_impl_data._M_start);
      }
      else {
        pfVar20 = (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar7 = (pvVar19->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        bVar36 = pfVar20 != pfVar7;
        if (bVar36) {
          fVar37 = *pfVar20;
          while (fVar37 <= 0.0) {
            pfVar20 = pfVar20 + 1;
            bVar36 = pfVar20 != pfVar7;
            if (pfVar20 == pfVar7) break;
            fVar37 = *pfVar20;
          }
        }
        if (bVar36) goto LAB_00103c93;
      }
      uVar22 = (ulong)(uVar31 + 1);
      pvVar19 = (event_guls->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar33 = ((long)(event_guls->
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar19 >> 3) *
               -0x5555555555555555;
    } while (uVar22 <= uVar33 && uVar33 - uVar22 != 0);
  }
  pvVar35 = aggid_to_vectorlookups.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (aggid_to_vectorlookups.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      aggid_to_vectorlookups.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      piVar10 = (pvVar35->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (piVar10 != (pointer)0x0) {
        operator_delete(piVar10);
      }
      pvVar35 = pvVar35 + 1;
    } while (pvVar35 !=
             aggid_to_vectorlookups.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    aggid_to_vectorlookups.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         aggid_to_vectorlookups.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((_Rb_tree_header *)outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &outmap._M_t._M_impl.super__Rb_tree_header) {
    p_Var21 = outmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      fwrite(&event_id_local,4,1,_stdout);
      fwrite(p_Var21 + 1,4,1,_stdout);
      p_Var14 = p_Var21[1]._M_left;
      for (__ptr = p_Var21[1]._M_parent; __ptr != p_Var14; __ptr = (_Base_ptr)&__ptr->_M_parent) {
        fwrite(__ptr,8,1,_stdout);
      }
      r.sidx = 0;
      r.loss = 0.0;
      fwrite(&r,8,1,_stdout);
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
    } while ((_Rb_tree_header *)p_Var21 != &outmap._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<fmlevelrec,_std::allocator<fmlevelrec>_>_>_>_>
  ::~_Rb_tree(&outmap._M_t);
  std::
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  ::~vector(&agg_vecs);
  std::
  vector<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>,_std::allocator<std::vector<std::vector<policytcvidx,_std::allocator<policytcvidx>_>,_std::allocator<std::vector<policytcvidx,_std::allocator<policytcvidx>_>_>_>_>_>
  ::~vector(&avxs);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&aggid_to_vectorlookups);
  return;
}

Assistant:

void fmcalc::dofm(int event_id, const std::vector<int> &items, std::vector<vector<OASIS_FLOAT>> &event_guls)
{
	
	const int level = 0;
	std::vector<std::vector<int>>  aggid_to_vectorlookups(maxLevel_ + 1);

	std::vector<int> &aggid_to_vectorlookup = aggid_to_vectorlookups[level];	
	int size = level_to_maxagg_id_[level];
	if (size == -1) {
		fprintf(stderr, "FATAL: Error: Possible level %d not initialized\n", level);
		exit(-1);
	}
	else {
		aggid_to_vectorlookup.resize(size, -2);
	}

	const int layer_id = 1;
	std::vector<std::vector<std::vector<policytcvidx>>> avxs;
	int total_loss_items = 0;
    avxs.resize(maxLevel_ + 1);
	if (event_guls.size() > 0) {
		auto &guls = event_guls[0];		// pick any set of events they'll all have the same size we just want the size
		std::vector<std::vector<policytcvidx>> &avx = avxs[level];

		avx.resize(max_layer_+1);
		for (unsigned int i = 0;i < guls.size();i++) {
			int agg_id = pfm_vec_vec_[level][items[i]];

			int current_idx = aggid_to_vectorlookup[agg_id-1];
			if (current_idx == -2) {
				policytcvidx a;
				a.agg_id = agg_id;
				a.policytc_id = policy_tc_vec_vec_vec_[level][agg_id][layer_id];
				avx[layer_id].push_back(a);			// populate the first layer
				avx[layer_id][avx[layer_id].size() - 1].item_idx.push_back(i);
				aggid_to_vectorlookup[agg_id-1] = (int) avx[layer_id].size() - 1;
				total_loss_items++;
			}
			else {
				avx[layer_id][current_idx].item_idx.push_back(i);
			}
			
		}
		       
		for (unsigned int zzlevel = 1;zzlevel < avxs.size();zzlevel++) {
			std::vector<std::vector<policytcvidx>>  &prev = avxs[zzlevel-1];
			std::vector<std::vector<policytcvidx>>  &next = avxs[zzlevel];
			next.resize(max_layer_ + 1);

			std::vector<int> &zzaggid_to_vectorlookup = aggid_to_vectorlookups[zzlevel]; // 
			int size = level_to_maxagg_id_[zzlevel];
			if (size == -1) {
				fprintf(stderr, "FATAL:Error possible level %d not initialized\n", zzlevel);
				exit(-1);
			}
			else {
				zzaggid_to_vectorlookup.resize(size, -2);
			}
			
			int previous_layer = 1; // previous layer is always one because only the last layer can be greater than 1

			for (unsigned int i = 0;i < prev[previous_layer].size();i++) {
				int agg_id = pfm_vec_vec_[zzlevel][prev[previous_layer][i].agg_id];
				int current_idx = zzaggid_to_vectorlookup[agg_id-1];
				if (current_idx == -2)		// field not initialized
				{

					for (unsigned int layer = 1; layer < policy_tc_vec_vec_vec_[zzlevel][agg_id].size() ; layer++ ){ // loop through layers
						struct policytcvidx a;
						const int policytc_id = policy_tc_vec_vec_vec_[zzlevel][agg_id][layer];

						a.agg_id = agg_id;
						a.policytc_id = policytc_id;

						next[layer].push_back(a);
						
						size_t current_idx = next[layer].size() - 1;
						for (int x : prev[previous_layer][i].item_idx) {
							next[layer][current_idx].item_idx.push_back(x);	
						}
						zzaggid_to_vectorlookup[agg_id-1] = (int) next[layer].size() - 1; // temp use for getting 
					}						
				}
				else {
					for (unsigned int layer = 1; layer < policy_tc_vec_vec_vec_[zzlevel][agg_id].size(); layer++) { // loop through layers
						//const int policytc_id = policy_tc_vec_vec_vec_[zzlevel][agg_id][layer];
						for (int x : prev[previous_layer][i].item_idx) {
							next[layer][current_idx].item_idx.push_back(x);	
						}
					}

				}
			}
		}
	}

	vector<vector<vector <LossRec>>>agg_vecs(maxLevel_ + 1);
	for (int i = 0; i < maxLevel_ + 1; i++) {
		agg_vecs[i].resize(max_layer_ + 1);
	}
	vector <LossRec> &agg_vec = agg_vecs[level][layer_id];
	std::map<int, std::vector<fmlevelrec>> outmap;
	
	for (unsigned int gul_idx = 0; gul_idx < event_guls.size(); gul_idx++) {    // loop sample + 1 times
		const std::vector<OASIS_FLOAT>& guls = event_guls[gul_idx];
		if (gul_idx < 2 || gulhasvalue(guls)) {
			agg_vec.resize(total_loss_items);
			//fmlevelhdr fmhdr;
			//fmhdr.event_id = event_id;
			const std::vector<std::vector<policytcvidx>> &avx = avxs[level];
			for (unsigned int i = 0; i < agg_vec.size(); i++) agg_vec[i].loss = 0;
			int last_agg_id = -1;
			int vec_idx = 0;
			for (unsigned int i = 0; i < guls.size(); i++) {
				int agg_id = pfm_vec_vec_[level][items[i]];
				if (last_agg_id != agg_id) {
					vec_idx = aggid_to_vectorlookup[agg_id - 1];
					last_agg_id = agg_id;
				}
				agg_vec[vec_idx].loss += guls[i];
				int vid = aggid_to_vectorlookup[agg_id - 1];
				agg_vec[vec_idx].agg_id = avx[1][vid].agg_id;
				agg_vec[vec_idx].item_idx = &avx[1][vid].item_idx;
				if (isGULStreamType_ == true) {
				    agg_vec[vec_idx].accumulated_tiv = item_to_tiv_[items[i]];
				} else agg_vec[vec_idx].accumulated_tiv = 0;
				agg_vec[vec_idx].policytc_id = avx[1][vid].policytc_id;
			}
			
			dofmcalc_r(aggid_to_vectorlookups, agg_vecs, level + 1, maxLevel_, outmap, gul_idx, avxs, 1, items, event_guls,1);

			agg_vec.clear();
		}
	}
	aggid_to_vectorlookups.clear();
	// Do output
	for (const auto &x : outmap) {
		fwrite(&event_id, sizeof(event_id), 1, stdout);
		fwrite(&x.first, sizeof(x.first), 1, stdout);
		for (const auto &y : x.second) {
			fwrite(&y, sizeof(y), 1, stdout);
		}
		fmlevelrec r;
		r.sidx = 0;
		r.loss = 0;
		fwrite(&r, sizeof(r), 1, stdout); // terminate rows
	}
}